

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryPropertyExprSyntax,slang::syntax::SyntaxKind&,slang::syntax::PropertyExprSyntax&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,SyntaxKind *args,PropertyExprSyntax *args_1,Token *args_2,
          PropertyExprSyntax *args_3)

{
  Token op;
  BinaryPropertyExprSyntax *this_00;
  PropertyExprSyntax *args_local_3;
  Token *args_local_2;
  PropertyExprSyntax *args_local_1;
  SyntaxKind *args_local;
  BumpAllocator *this_local;
  
  this_00 = (BinaryPropertyExprSyntax *)allocate(this,0x30,8);
  op.kind = args_2->kind;
  op._2_1_ = args_2->field_0x2;
  op.numFlags.raw = (args_2->numFlags).raw;
  op.rawLen = args_2->rawLen;
  op.info = args_2->info;
  slang::syntax::BinaryPropertyExprSyntax::BinaryPropertyExprSyntax(this_00,*args,args_1,op,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }